

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles3::Functional::(anonymous_namespace)::ConstantShaderGenerator::next_abi_cxx11_
          (string *__return_storage_ptr__,void *this,ShaderType shaderType)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  float fVar4;
  string outputName;
  string valueString;
  ostringstream out;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  undefined1 local_198 [376];
  
  fVar4 = deRandom_getFloat((deRandom *)((long)this + 8));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ostream::_M_insert<double>((double)(fVar4 + 0.0));
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  pcVar3 = "o_fragColor";
  if (shaderType == SHADERTYPE_VERTEX) {
    pcVar3 = "gl_Position";
  }
  pcVar2 = "";
  if (shaderType == SHADERTYPE_VERTEX) {
    pcVar2 = "";
  }
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,pcVar3,pcVar2);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"#version 300 es\n",0x10);
  if (shaderType == SHADERTYPE_FRAGMENT) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"layout(location = 0) out mediump vec4 o_fragColor;\n",0x33);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\t",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(char *)local_1d8,local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = vec4(",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_1b8,local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,");\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ConstantShaderGenerator::next (const glu::ShaderType shaderType)
{
	DE_ASSERT(shaderType == glu::SHADERTYPE_VERTEX || shaderType == glu::SHADERTYPE_FRAGMENT);

	const float			value		= m_rnd.getFloat(0.0f, 1.0f);
	const std::string	valueString	= de::toString(value);
	const std::string	outputName	= (shaderType == glu::SHADERTYPE_VERTEX) ? "gl_Position" : "o_fragColor";

	std::ostringstream	out;

	out << "#version 300 es\n";

	if (shaderType == glu::SHADERTYPE_FRAGMENT)
		out << "layout(location = 0) out mediump vec4 o_fragColor;\n";

	out << "void main (void)\n";
	out << "{\n";
	out << "	" << outputName << " = vec4(" << valueString << ");\n";
	out << "}\n";

	return out.str();
}